

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pruned_spherical_quadrature.hpp
# Opt level: O0

void __thiscall
IntegratorXX::RadialGridPartition<IntegratorXX::LebedevLaikov<double>>::
add_quad<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>>
          (RadialGridPartition<IntegratorXX::LebedevLaikov<double>> *this,
          RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>
          *rq,size_t idx,Quadrature<IntegratorXX::LebedevLaikov<double>_> *q)

{
  Quadrature<IntegratorXX::LebedevLaikov<double>_> *pQVar1;
  Quadrature<IntegratorXX::LebedevLaikov<double>_> *pQVar2;
  size_type sVar3;
  reference pvVar4;
  size_t sVar5;
  bool bVar6;
  Quadrature<IntegratorXX::LebedevLaikov<double>_> *q_local;
  size_t idx_local;
  RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>
  *rq_local;
  RadialGridPartition<IntegratorXX::LebedevLaikov<double>_> *this_local;
  
  q_local = (Quadrature<IntegratorXX::LebedevLaikov<double>_> *)idx;
  idx_local = (size_t)rq;
  rq_local = (RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>
              *)this;
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
  pQVar1 = q_local;
  if (sVar3 == 0) {
    bVar6 = q_local == (Quadrature<IntegratorXX::LebedevLaikov<double>_> *)0x0;
  }
  else {
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
    pQVar2 = q_local;
    bVar6 = false;
    if ((Quadrature<IntegratorXX::LebedevLaikov<double>_> *)*pvVar4 < pQVar1) {
      sVar5 = QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
              ::npts((QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                      *)idx_local);
      bVar6 = pQVar2 < (Quadrature<IntegratorXX::LebedevLaikov<double>_> *)(sVar5 - 1);
    }
  }
  if (bVar6) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)this,(unsigned_long *)&q_local
              );
    std::
    vector<IntegratorXX::Quadrature<IntegratorXX::LebedevLaikov<double>>,std::allocator<IntegratorXX::Quadrature<IntegratorXX::LebedevLaikov<double>>>>
    ::emplace_back<IntegratorXX::Quadrature<IntegratorXX::LebedevLaikov<double>>const&>
              ((vector<IntegratorXX::Quadrature<IntegratorXX::LebedevLaikov<double>>,std::allocator<IntegratorXX::Quadrature<IntegratorXX::LebedevLaikov<double>>>>
                *)(this + 0x18),q);
    return;
  }
  __assert_fail("partition_idx_.size() ? (idx > partition_idx_.back() && idx < (rq.npts()-1)) : (idx == 0)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/wavefunction91[P]IntegratorXX/include/integratorxx/composite_quadratures/pruned_spherical_quadrature.hpp"
                ,0x26,
                "void IntegratorXX::RadialGridPartition<IntegratorXX::LebedevLaikov<double>>::add_quad(const RadialQuad &, size_t, const Quadrature<AngularQuad> &) [AngularQuad = IntegratorXX::LebedevLaikov<double>, RadialQuad = IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double, double>, IntegratorXX::MuraKnowlesRadialTraits>]"
               );
}

Assistant:

void add_quad( const RadialQuad& rq, size_t idx, 
		  const Quadrature<AngularQuad>& q ) { 
    assert(partition_idx_.size() ?
      (idx > partition_idx_.back() && idx < (rq.npts()-1)) : (idx == 0));
    (void)(rq);

    partition_idx_.emplace_back(idx);
    quads_.emplace_back(q);
  }